

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

void __thiscall CChat::HandleCommands(CChat *this,float x,float y,float w)

{
  ulong uVar1;
  bool *pbVar2;
  byte bVar3;
  int iVar4;
  bool *pbVar5;
  ITextRender *pIVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  CCommand *pCVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  long in_FS_OFFSET;
  bool bVar25;
  anon_union_4_2_94730017_for_vector4_base<float>_7 aVar26;
  float fVar27;
  CUIRect Rect_1;
  CUIRect Rect;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 local_84;
  int local_80;
  anon_union_4_2_94730039_for_vector4_base<float>_5 local_7c;
  vec4 local_68;
  vec4 local_58;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_48;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 local_44;
  float local_40;
  anon_union_4_2_94730017_for_vector4_base<float>_7 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_Mode == 0) || (*(this->m_Input).m_pStr != '/')) ||
     ((this->m_IgnoreCommand & 1U) != 0)) goto LAB_0013b2f7;
  FilterChatCommands(this,(this->m_Input).m_pStr);
  iVar17 = (this->m_CommandManager).m_aCommands.num_elements;
  iVar11 = iVar17 - this->m_FilteredCount;
  iVar24 = 0x10;
  if (iVar11 < 0x10) {
    iVar24 = iVar11;
  }
  iVar17 = iVar17 - this->m_FilteredCount;
  if (iVar17 != 0) {
    pbVar5 = (this->m_aFilter).list;
    if (pbVar5[this->m_SelectedCommand] == true) {
      this->m_SelectedCommand = -1;
      uVar19 = (this->m_aFilter).num_elements;
      uVar14 = 0;
      uVar22 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar22 = uVar14;
      }
      do {
        if (uVar22 == uVar14) goto LAB_0013ab4e;
        uVar1 = uVar14 + 1;
        pbVar2 = pbVar5 + uVar14;
        uVar14 = uVar1;
      } while (*pbVar2 != false);
      uVar22 = (ulong)((int)uVar1 - 1);
LAB_0013ab4e:
      this->m_SelectedCommand = (int)uVar22;
    }
    if (pbVar5[this->m_CommandStart] == true) {
      uVar19 = (this->m_aFilter).num_elements;
      uVar14 = (ulong)this->m_CommandStart;
      uVar18 = this->m_CommandStart + 1;
      uVar22 = uVar14;
      if ((int)uVar18 < (int)uVar19) {
        uVar18 = uVar19;
      }
      do {
        uVar22 = uVar22 + 1;
        uVar12 = uVar18;
        if ((long)(int)uVar19 <= (long)uVar22) break;
        uVar12 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar12;
      } while (pbVar5[uVar22] != false);
      this->m_CommandStart = uVar12;
    }
  }
  if (iVar17 < 1) goto LAB_0013b2f7;
  aVar26.w = (float)(iVar24 + 1) * 8.0;
  local_58.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3e000000;
  local_58.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3e000000;
  local_58.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3e000000;
  local_58.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f666666;
  local_48.x = x;
  local_44.y = y - aVar26.w;
  local_40 = w;
  local_3c.w = aVar26.w;
  CUIRect::Draw((CUIRect *)&local_48,&local_58,3.0,0xf);
  iVar11 = this->m_CommandStart;
  if (iVar17 != 1) {
    iVar4 = (this->m_aFilter).num_elements;
    iVar13 = 2;
    if (2 < iVar24) {
      iVar13 = iVar24;
    }
    iVar21 = 0;
    do {
      lVar23 = (long)iVar11;
      iVar7 = iVar11 + 1;
      if (iVar11 + 1 < iVar4) {
        iVar7 = iVar4;
      }
      do {
        lVar23 = lVar23 + 1;
        iVar9 = iVar7;
        if (iVar4 <= lVar23) break;
        iVar11 = iVar11 + 1;
        iVar9 = iVar11;
      } while ((this->m_aFilter).list[lVar23] != false);
      iVar11 = iVar9;
      bVar25 = iVar21 != iVar13 + -2;
      iVar21 = iVar21 + 1;
    } while (bVar25);
  }
  iVar4 = (this->m_CommandManager).m_aCommands.num_elements;
  iVar13 = iVar11 - iVar4;
  if ((iVar4 <= iVar11) && (-1 < iVar13)) {
    uVar22 = (ulong)(uint)this->m_CommandStart;
    do {
      uVar19 = (uint)uVar22;
      uVar22 = (ulong)(((int)uVar19 >> 0x1f & uVar19) - 1);
      uVar14 = (long)(int)uVar19;
      do {
        if ((long)uVar14 < 1) goto LAB_0013aca8;
        uVar1 = uVar14 - 1;
        lVar23 = uVar14 - 1;
        uVar14 = uVar1;
      } while ((this->m_aFilter).list[lVar23] != false);
      uVar22 = uVar1 & 0xffffffff;
LAB_0013aca8:
      bVar25 = 0 < iVar13;
      iVar13 = iVar13 + -1;
    } while (bVar25);
    this->m_CommandStart = (int)uVar22;
  }
  uVar19 = this->m_CommandStart;
  if (this->m_SelectedCommand < (int)uVar19) {
    lVar23 = (long)(int)uVar19;
    do {
      uVar12 = ((int)uVar19 >> 0x1f & uVar19) - 1;
      if (lVar23 < 1) goto LAB_0013ad2b;
      lVar15 = lVar23 + -1;
      lVar8 = lVar23 + -1;
      lVar23 = lVar15;
    } while ((this->m_aFilter).list[lVar8] != false);
    uVar12 = (uint)lVar15;
LAB_0013ad2b:
    this->m_CommandStart = uVar12;
  }
  else if (iVar11 < this->m_SelectedCommand) {
    uVar19 = (this->m_aFilter).num_elements;
    uVar14 = (ulong)this->m_CommandStart;
    uVar18 = this->m_CommandStart + 1;
    uVar22 = uVar14;
    if ((int)uVar18 < (int)uVar19) {
      uVar18 = uVar19;
    }
    do {
      uVar22 = uVar22 + 1;
      uVar12 = uVar18;
      if ((long)(int)uVar19 <= (long)uVar22) break;
      uVar12 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar12;
    } while ((this->m_aFilter).list[uVar22] != false);
    goto LAB_0013ad2b;
  }
  local_7c.z = w;
  if (0x10 < iVar17) {
    local_7c.z = w + -6.0;
    local_58.field_0.x = x + local_7c.z;
    local_58.field_2.z = 6.0;
    local_68.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3e000000;
    local_68.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3e000000;
    local_68.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3e000000;
    local_68.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f666666;
    local_58.field_3.w = aVar26.w;
    local_58.field_1.y = y - aVar26.w;
    CUIRect::Draw((CUIRect *)&local_58,&local_68,3.0,10);
    aVar26 = local_58.field_3;
    local_58.field_3.w = ((float)iVar24 / (float)iVar17) * local_58.field_3.w;
    lVar23 = (long)(this->m_CommandManager).m_aCommands.num_elements;
    iVar11 = -1;
    if (0 < lVar23) {
      lVar15 = 0;
      do {
        if ((this->m_aFilter).list[lVar15] != true) {
          iVar11 = (int)lVar15;
          break;
        }
        lVar15 = lVar15 + 1;
      } while (lVar23 != lVar15);
    }
    fVar27 = 0.0;
    if (iVar11 < this->m_CommandStart) {
      lVar23 = (long)iVar11;
      iVar11 = 0;
      do {
        pbVar5 = (this->m_aFilter).list + lVar23;
        lVar23 = lVar23 + 1;
        iVar11 = iVar11 + (*pbVar5 ^ 1);
      } while (this->m_CommandStart != lVar23);
      fVar27 = (float)iVar11;
    }
    local_58.field_1.y = (aVar26.w * fVar27) / (float)iVar17 + local_58.field_1.y;
    local_68.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f000000;
    local_68.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f000000;
    local_68.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f000000;
    local_68.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f666666;
    CUIRect::Draw((CUIRect *)&local_58,&local_68,3.0,10);
  }
  local_84.y = y + (float)(iVar24 + 2) * -8.0;
  lVar23 = (long)this->m_CommandStart;
  if (this->m_CommandStart < (this->m_CommandManager).m_aCommands.num_elements) {
    local_80 = 0;
LAB_0013aeaf:
    if (((this->m_aFilter).list[lVar23] == false) &&
       (pCVar20 = (this->m_CommandManager).m_aCommands.list,
       pCVar20 != (CCommand *)0x0 && -1 < lVar23)) {
      pCVar20 = pCVar20 + lVar23;
      local_84.y = local_84.y + 8.0;
      local_58.field_1.y = local_84.y;
      local_58.field_0.x = local_48.x;
      local_58.field_3.w = 7.0;
      local_58.field_2.z = local_7c.z;
      if (pCVar20->m_pfnCallback == ServerCommandCallback) {
        local_68.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
        local_68.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f19999a;
        local_68.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f19999a;
        local_68.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3e4ccccd;
        CUIRect::Draw((CUIRect *)&local_58,&local_68,0.0,0xf);
      }
      if (this->m_SelectedCommand == (int)lVar23) {
        local_68.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3e800000;
        local_68.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3e800000;
        local_68.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f19999a;
        local_68.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f666666;
        CUIRect::Draw((CUIRect *)&local_58,&local_68,2.0,0xf);
      }
      if ((HandleCommands(float,float,float)::s_CommandCursor == '\0') &&
         (iVar17 = __cxa_guard_acquire(&HandleCommands(float,float,float)::s_CommandCursor),
         iVar17 != 0)) {
        CTextCursor::CTextCursor(&HandleCommands::s_CommandCursor,5.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&HandleCommands::s_CommandCursor,&__dso_handle);
        __cxa_guard_release(&HandleCommands(float,float,float)::s_CommandCursor);
      }
      local_80 = local_80 + 1;
      CTextCursor::Reset(&HandleCommands::s_CommandCursor,-1);
      HandleCommands::s_CommandCursor.m_CursorPos.field_0.x = local_48.x + 5.0;
      HandleCommands::s_CommandCursor.m_CursorPos.field_1.y = local_84.y;
      (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
      pIVar6 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar6->super_IInterface)._vptr_IInterface[7])
                (pIVar6,&HandleCommands::s_CommandCursor,pCVar20,0xffffffff);
      pIVar6 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar6->super_IInterface)._vptr_IInterface[7])
                (pIVar6,&HandleCommands::s_CommandCursor," ",0xffffffff);
      (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0,0x3f000000,0x3f000000,0x3f800000);
      pcVar10 = pCVar20->m_aArgsFormat;
      do {
        bVar3 = *pcVar10;
        if (bVar3 < 0x70) {
          if (bVar3 == 99) {
            pcVar16 = "<subcommand> ";
            goto LAB_0013b093;
          }
          pcVar16 = "<number> ";
          if (bVar3 == 0x69) goto LAB_0013b093;
          if (bVar3 == 0) goto LAB_0013b0b1;
        }
        else {
          if (bVar3 == 0x70) {
            pcVar16 = "<playername> ";
          }
          else {
            if (bVar3 != 0x73) goto LAB_0013b0ac;
            pcVar16 = "<text> ";
          }
LAB_0013b093:
          pIVar6 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar6->super_IInterface)._vptr_IInterface[7])
                    (pIVar6,&HandleCommands::s_CommandCursor,pcVar16,0xffffffff);
        }
LAB_0013b0ac:
        pcVar10 = pcVar10 + 1;
      } while( true );
    }
    goto LAB_0013b148;
  }
LAB_0013b1b1:
  if ((HandleCommands(float,float,float)::s_NotificationCursor == '\0') &&
     (iVar17 = __cxa_guard_acquire(&HandleCommands(float,float,float)::s_NotificationCursor),
     iVar17 != 0)) {
    CTextCursor::CTextCursor(&HandleCommands::s_NotificationCursor,5.0,0);
    __cxa_atexit(CTextCursor::~CTextCursor,&HandleCommands::s_NotificationCursor,&__dso_handle);
    __cxa_guard_release(&HandleCommands(float,float,float)::s_NotificationCursor);
  }
  CTextCursor::Reset(&HandleCommands::s_NotificationCursor,-1);
  HandleCommands::s_NotificationCursor.m_CursorPos.field_0.x = local_48.x + 5.0;
  HandleCommands::s_NotificationCursor.m_CursorPos.field_1.y = local_84.y + 8.0;
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  iVar17 = this->m_SelectedCommand;
  if ((long)iVar17 < 0) {
LAB_0013b275:
    pcVar10 = "Press Tab to select or Esc to cancel";
  }
  else {
    pCVar20 = (CCommand *)0x0;
    if (iVar17 < (this->m_CommandManager).m_aCommands.num_elements) {
      pCVar20 = (this->m_CommandManager).m_aCommands.list + iVar17;
    }
    pcVar10 = str_startswith((this->m_Input).m_pStr + 1,pCVar20->m_aName);
    if (pcVar10 == (char *)0x0) goto LAB_0013b275;
    pcVar10 = "Press Enter to confirm or Esc to cancel";
  }
  pIVar6 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  pcVar10 = Localize(pcVar10,"");
  (*(pIVar6->super_IInterface)._vptr_IInterface[7])
            (pIVar6,&HandleCommands::s_NotificationCursor,pcVar10,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  pIVar6 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar6->super_IInterface)._vptr_IInterface[0x10])
            (0x3f800000,pIVar6,&HandleCommands::s_NotificationCursor,0,0xffffffff);
LAB_0013b2f7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_0013b0b1:
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  pIVar6 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar6->super_IInterface)._vptr_IInterface[7])
            (pIVar6,&HandleCommands::s_CommandCursor,pCVar20->m_aHelpText,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  pIVar6 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar6->super_IInterface)._vptr_IInterface[0x10])
            (0x3f800000,pIVar6,&HandleCommands::s_CommandCursor,0,0xffffffff);
LAB_0013b148:
  if ((iVar24 <= local_80) ||
     (lVar23 = lVar23 + 1, (this->m_CommandManager).m_aCommands.num_elements <= lVar23))
  goto LAB_0013b1b1;
  goto LAB_0013aeaf;
}

Assistant:

void CChat::HandleCommands(float x, float y, float w)
{
	// render commands menu
	if(m_Mode != CHAT_NONE && IsTypingCommand())
	{
		const float Alpha = 0.90f;
		const float ScrollBarW = 6.0f;
		float LineWidth = w;
		const float LineHeight = 8.0f;

		FilterChatCommands(m_Input.GetString()); // flag active commands, update selected command
		const int ActiveCount = m_CommandManager.CommandCount() - m_FilteredCount;
		const int DisplayCount = minimum(ActiveCount, 16);

		if(DisplayCount && m_aFilter[m_SelectedCommand])
		{
			m_SelectedCommand = -1;
			NextActiveCommand(&m_SelectedCommand);
		}
		if(DisplayCount && m_aFilter[m_CommandStart])
		{
			NextActiveCommand(&m_CommandStart);
		}

		if(DisplayCount > 0) // at least one command to display
		{
			CUIRect Rect = {x, y-(DisplayCount+1)*LineHeight, LineWidth, (DisplayCount+1)*LineHeight};
			Rect.Draw(vec4(0.125f, 0.125f, 0.125f, Alpha), 3.0f);

			int End = m_CommandStart;
			for(int i = 0; i < DisplayCount - 1; i++)
				NextActiveCommand(&End);

			if(End >= m_CommandManager.CommandCount())
				for(int i = End - m_CommandManager.CommandCount(); i >= 0; i--)
					PreviousActiveCommand(&m_CommandStart);

			if(m_SelectedCommand < m_CommandStart)
			{
				PreviousActiveCommand(&m_CommandStart);
			}
			else if(m_SelectedCommand > End)
			{
				NextActiveCommand(&m_CommandStart);
				NextActiveCommand(&End);
			}

			// render worlds most inefficient "scrollbar"
			if(ActiveCount > DisplayCount)
			{
				LineWidth -= ScrollBarW;

				CUIRect Rect = {x + LineWidth, y - (DisplayCount + 1) * LineHeight, ScrollBarW, (DisplayCount+1)*LineHeight};
				Rect.Draw(vec4(0.125f, 0.125f, 0.125f, Alpha), 3.0f, CUIRect::CORNER_R);

				float h = Rect.h;
				Rect.h *= (float)DisplayCount/ActiveCount;
				Rect.y += h * (float)(GetActiveCountRange(GetFirstActiveCommand(), m_CommandStart))/ActiveCount;
				Rect.Draw(vec4(0.5f, 0.5f, 0.5f, Alpha), 3.0f, CUIRect::CORNER_R);
			}

			y -= (DisplayCount+2)*LineHeight;
			for(int i = m_CommandStart, j = 0; j < DisplayCount && i < m_CommandManager.CommandCount(); i++)
			{
				if(m_aFilter[i])
					continue;

				const CCommandManager::CCommand *pCommand = m_CommandManager.GetCommand(i);
				if(!pCommand)
					continue;

				j++;

				y += LineHeight;
				CUIRect HighlightRect = {Rect.x, y, LineWidth, LineHeight-1};

				if(pCommand->m_pfnCallback == ServerCommandCallback)
					HighlightRect.Draw(vec4(0.0f, 0.6f, 0.6f, 0.2f), 0);

				// draw selection box
				if(i == m_SelectedCommand)
					HighlightRect.Draw(vec4(0.25f, 0.25f, 0.6f, Alpha), 2.0f);

				// print command
				static CTextCursor s_CommandCursor(5.0f);
				s_CommandCursor.Reset();
				s_CommandCursor.MoveTo(Rect.x + 5.0f, y);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
				TextRender()->TextDeferred(&s_CommandCursor, pCommand->m_aName, -1);
				TextRender()->TextDeferred(&s_CommandCursor, " ", -1);

				TextRender()->TextColor(0.0f, 0.5f, 0.5f, 1.0f);
				for(const char *pArg = pCommand->m_aArgsFormat; *pArg; pArg++)
				{
					if(*pArg == 'i') // Integer argument
						TextRender()->TextDeferred(&s_CommandCursor, "<number> ", -1);
					else if(*pArg == 'p') // Player name argument
						TextRender()->TextDeferred(&s_CommandCursor, "<playername> ", -1);
					else if(*pArg == 's') // String argument
						TextRender()->TextDeferred(&s_CommandCursor, "<text> ", -1);
					else if(*pArg == 'c') // Subcommand argument
						TextRender()->TextDeferred(&s_CommandCursor, "<subcommand> ", -1);
				}
				TextRender()->TextColor(0.5f, 0.5f, 0.5f, 1.0f);
				TextRender()->TextDeferred(&s_CommandCursor, pCommand->m_aHelpText, -1);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
				TextRender()->DrawTextOutlined(&s_CommandCursor);
			}

			// render notification
			{
				y += LineHeight;
				static CTextCursor s_NotificationCursor(5.0f);
				s_NotificationCursor.Reset();
				s_NotificationCursor.MoveTo(Rect.x + 5.0f, y);
				TextRender()->TextColor(0.5f, 0.5f, 0.5f, 1.0f);
				if(m_SelectedCommand >= 0 && str_startswith(m_Input.GetString() + 1, m_CommandManager.GetCommand(m_SelectedCommand)->m_aName))
					TextRender()->TextDeferred(&s_NotificationCursor, Localize("Press Enter to confirm or Esc to cancel"), -1);
				else
					TextRender()->TextDeferred(&s_NotificationCursor, Localize("Press Tab to select or Esc to cancel"), -1);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
				TextRender()->DrawTextOutlined(&s_NotificationCursor);
			}
		}
	}
}